

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
despot::Parser::PrintState(Parser *this,vector<int,_std::allocator<int>_> *state,ostream *out)

{
  int iVar1;
  pointer pSVar2;
  long lVar3;
  ostream *poVar4;
  int s;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  
  std::operator<<(out,"[");
  lVar7 = 0x58;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    pcVar6 = ", ";
    if (uVar5 == 0) {
      pcVar6 = "";
    }
    poVar4 = std::operator<<(out,pcVar6);
    poVar4 = std::operator<<(poVar4,(string *)
                                    ((long)&(((this->curr_state_vars_).
                                              super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super_NamedVar).super_Variable._vptr_Variable + lVar7));
    std::operator<<(poVar4,":");
    iVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[uVar5];
    pSVar2 = (this->curr_state_vars_).
             super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = *(long *)((long)pSVar2 + lVar7 + -0x50);
    if (iVar1 < (int)((ulong)(*(long *)((long)pSVar2 + lVar7 + -0x48) - lVar3) >> 5)) {
      std::operator<<(out,(string *)(lVar3 + (long)iVar1 * 0x20));
    }
    else {
      std::ostream::operator<<(out,iVar1);
    }
    lVar7 = lVar7 + 0xc0;
  }
  poVar4 = std::operator<<(out,"]");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void Parser::PrintState(const vector<int>& state, ostream& out) const {
	out << "[";
	for (int s = 0; s < state.size(); s++) {
		out << (s == 0 ? "" : ", ") << curr_state_vars_[s].name() << ":";
		if (state[s] >= curr_state_vars_[s].Size()) {
			// allow POMDPX::current_->PrintState to work in POMDPXState::text when 
			// state is not defined in current_, but the names of the state
			// components are defined
			out << state[s];
		} else {
			out << curr_state_vars_[s].GetValue(state[s]);
		}
	}
	out << "]" << endl;
}